

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O2

void do_cmd_roll_stats(command *cmd)

{
  int iVar1;
  player *ppVar2;
  short sVar3;
  int16_t iVar4;
  uint32_t uVar5;
  char *pcVar6;
  long lVar7;
  int *piVar8;
  int iVar9;
  uint uVar10;
  wchar_t *pwVar11;
  wchar_t dice [15];
  
  save_roller_data(&prev);
  lVar7 = 0;
  iVar9 = 0;
  do {
    for (; lVar7 != 0xf; lVar7 = lVar7 + 1) {
      uVar5 = Rand_div((uint)(byte)((char)(((ushort)lVar7 & 0xff) % 3) + 3));
      dice[lVar7] = uVar5 + L'\x01';
      iVar9 = iVar9 + uVar5 + 1;
    }
    uVar10 = iVar9 - 0x24;
    lVar7 = 0;
    iVar9 = 0;
  } while (8 < uVar10);
  piVar8 = stats;
  pwVar11 = dice + 2;
  for (lVar7 = 0; ppVar2 = player, lVar7 != 5; lVar7 = lVar7 + 1) {
    sVar3 = (short)pwVar11[-2] + (short)pwVar11[-1] + (short)*pwVar11 + 5;
    player->stat_max[lVar7] = sVar3;
    iVar9 = ppVar2->class->c_adj[lVar7];
    iVar1 = ppVar2->race->r_adj[lVar7];
    ppVar2->stat_cur[lVar7] = sVar3;
    ppVar2->stat_map[lVar7] = (int16_t)lVar7;
    iVar4 = modify_stat_value((int)sVar3,iVar9 + iVar1);
    *piVar8 = (int)iVar4;
    player->stat_birth[lVar7] = player->stat_max[lVar7];
    piVar8 = piVar8 + 1;
    pwVar11 = pwVar11 + 3;
  }
  get_bonuses();
  get_ahw(player);
  if (player->history != (char *)0x0) {
    string_free(player->history);
  }
  pcVar6 = get_history(player->race->history);
  player->history = pcVar6;
  event_signal(EVENT_GOLD);
  event_signal(EVENT_AC);
  event_signal(EVENT_HP);
  event_signal(EVENT_STATS);
  points_left = L'\0';
  for (lVar7 = 0; lVar7 != 0x14; lVar7 = lVar7 + 4) {
    *(undefined4 *)((long)points_spent + lVar7) = 0;
    *(undefined4 *)((long)points_inc + lVar7) = 0;
  }
  event_signal_birthpoints(points_spent,points_inc,L'\0');
  rolled_stats = 1;
  return;
}

Assistant:

void do_cmd_roll_stats(struct command *cmd)
{
	int i;

	save_roller_data(&prev);

	/* Get a new character */
	get_stats(stats);

	/* Update stats with bonuses, etc. */
	get_bonuses();

	/* There's no real need to do this here, but it's tradition. */
	get_ahw(player);
	if (player->history)
		string_free(player->history);
	player->history = get_history(player->race->history);

	event_signal(EVENT_GOLD);
	event_signal(EVENT_AC);
	event_signal(EVENT_HP);
	event_signal(EVENT_STATS);

	/* Give the UI some dummy info about the points situation. */
	points_left = 0;
	for (i = 0; i < STAT_MAX; i++) {
		points_spent[i] = 0;
		points_inc[i] = 0;
	}

	event_signal_birthpoints(points_spent, points_inc, points_left);

	/* Lock out buying and selling of stats based on rolled stats. */
	rolled_stats = true;
}